

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O2

void PatchOptimizeMaps::optimize_map_connections(World *world)

{
  MapConnection *pMVar1;
  
  pMVar1 = World::map_connection(world,0xc1,0xc4);
  if (pMVar1->_map_id_1 != 0xc1) {
    if (pMVar1->_map_id_2 != 0xc1) goto LAB_0014a055;
    pMVar1 = (MapConnection *)&pMVar1->_map_id_2;
  }
  pMVar1->_map_id_1 = 0xc0;
LAB_0014a055:
  pMVar1 = World::map_connection(world,0xba,0xbb);
  if (pMVar1->_map_id_1 != 0xba) {
    if (pMVar1->_map_id_2 != 0xba) {
      return;
    }
    pMVar1 = (MapConnection *)&pMVar1->_map_id_2;
  }
  pMVar1->_map_id_1 = 0xb9;
  return;
}

Assistant:

static void optimize_map_connections(World& world)
    {
        // Replace direct waterless variants references by parent map in Thieves Hideout
        world.map_connection(MAP_THIEVES_HIDEOUT_DOOR_BEHIND_WATERFALL_WATERLESS, MAP_THIEVES_HIDEOUT_BACK_ACCESS)
             .replace_map(MAP_THIEVES_HIDEOUT_DOOR_BEHIND_WATERFALL_WATERLESS, MAP_THIEVES_HIDEOUT_DOOR_BEHIND_WATERFALL);

        world.map_connection(MAP_THIEVES_HIDEOUT_ENTRANCE_WATERLESS, MAP_THIEVES_HIDEOUT_POCKETS_CELL_ACCESS_1)
             .replace_map(MAP_THIEVES_HIDEOUT_ENTRANCE_WATERLESS, MAP_THIEVES_HIDEOUT_ENTRANCE);

        // Replace direct solified magma variant reference by base version of Lake Shrine exterior map when leaving Lake Shrine
        // world.map_connection(MAP_LAKE_SHRINE_ENTRANCE, MAP_LAKE_SHRINE_EXTERIOR_WITH_MAGMA)
        //      .replace_map(MAP_LAKE_SHRINE_EXTERIOR_WITH_MAGMA, MAP_LAKE_SHRINE_EXTERIOR);
    }